

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O1

int base64_encode_block(char *plaintext_in,int length_in,char *code_out,base64_encodestate *state_in
                       )

{
  byte bVar1;
  uint uVar2;
  base64_encodestep bVar3;
  int iVar4;
  char *pcVar5;
  byte *pbVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  
  iVar4 = (int)code_out;
  pbVar6 = (byte *)(plaintext_in + length_in);
  bVar7 = state_in->result;
  uVar2 = (uint)bVar7;
  bVar3 = state_in->step;
  pcVar5 = code_out;
  if (bVar3 == step_C) goto LAB_00113f64;
  if (bVar3 == step_B) goto LAB_00113f26;
  if (bVar3 != step_A) {
    return 0;
  }
  do {
    bVar7 = (byte)uVar2;
    if ((byte *)plaintext_in == pbVar6) {
      bVar3 = step_A;
LAB_00113fea:
      state_in->result = bVar7;
      state_in->step = bVar3;
      return (int)code_out - iVar4;
    }
    bVar7 = *plaintext_in;
    plaintext_in = (char *)((byte *)plaintext_in + 1);
    *code_out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[bVar7 >> 2];
    code_out = code_out + 1;
    bVar7 = (bVar7 & 3) << 4;
LAB_00113f26:
    if ((byte *)plaintext_in == pbVar6) {
      bVar3 = step_B;
      goto LAB_00113fea;
    }
    bVar1 = *plaintext_in;
    plaintext_in = (char *)((byte *)plaintext_in + 1);
    bVar7 = bVar1 >> 4 | bVar7;
    cVar8 = '=';
    if ((char)bVar7 < '@') {
      cVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[(char)bVar7];
    }
    *code_out = cVar8;
    bVar7 = (bVar1 & 0xf) << 2;
    pcVar5 = code_out + 1;
LAB_00113f64:
    if ((byte *)plaintext_in == pbVar6) {
      bVar3 = step_C;
      code_out = pcVar5;
      goto LAB_00113fea;
    }
    bVar1 = *plaintext_in;
    plaintext_in = (char *)((byte *)plaintext_in + 1);
    bVar7 = bVar1 >> 6 | bVar7;
    cVar8 = '=';
    if ((char)bVar7 < '@') {
      cVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[(char)bVar7];
    }
    *pcVar5 = cVar8;
    uVar2 = bVar1 & 0x3f;
    code_out = pcVar5 + 2;
    pcVar5[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[uVar2];
    iVar9 = state_in->stepcount + 1;
    state_in->stepcount = iVar9;
    if (iVar9 == 0x12) {
      pcVar5[2] = '\n';
      code_out = pcVar5 + 3;
      state_in->stepcount = 0;
    }
  } while( true );
}

Assistant:

int base64_encode_block(const char* plaintext_in, int length_in, char* code_out, base64_encodestate* state_in)
{
	const char* plainchar = plaintext_in;
	const char* const plaintextend = plaintext_in + length_in;
	char* codechar = code_out;
	char result;
	char fragment;
	
	result = state_in->result;
	
	switch (state_in->step)
	{
		while (1)
		{
	case step_A:
			if (plainchar == plaintextend)
			{
				state_in->result = result;
				state_in->step = step_A;
				return codechar - code_out;
			}
			fragment = *plainchar++;
			result = (fragment & 0x0fc) >> 2;
			*codechar++ = base64url_encode_value(result);
			result = (fragment & 0x003) << 4;
	case step_B:
			if (plainchar == plaintextend)
			{
				state_in->result = result;
				state_in->step = step_B;
				return codechar - code_out;
			}
			fragment = *plainchar++;
			result |= (fragment & 0x0f0) >> 4;
			*codechar++ = base64url_encode_value(result);
			result = (fragment & 0x00f) << 2;
	case step_C:
			if (plainchar == plaintextend)
			{
				state_in->result = result;
				state_in->step = step_C;
				return codechar - code_out;
			}
			fragment = *plainchar++;
			result |= (fragment & 0x0c0) >> 6;
			*codechar++ = base64url_encode_value(result);
			result  = (fragment & 0x03f) >> 0;
			*codechar++ = base64url_encode_value(result);
			
			++(state_in->stepcount);
			if (state_in->stepcount == CHARS_PER_LINE/4)
			{
				*codechar++ = '\n';
				state_in->stepcount = 0;
			}
		}
	}
	/* control should not reach here */
	return codechar - code_out;
}